

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

eia608_control_t eia608_parse_control(uint16_t cc_data,int *cc)

{
  eia608_control_t eVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = (cc_data & 0x200) == 0;
  eVar1 = 0x177f;
  if (bVar3) {
    eVar1 = 0x147f;
  }
  uVar2 = 0;
  if (bVar3) {
    uVar2 = (cc_data & 0x100) >> 7;
  }
  *cc = uVar2 | (cc_data & 0x800) >> 0xb;
  return eVar1 & cc_data;
}

Assistant:

eia608_control_t eia608_parse_control(uint16_t cc_data, int* cc)
{
    if (0x0200 & cc_data) {
        (*cc) = (cc_data & 0x0800 ? 0x01 : 0x00);
        return (eia608_control_t)(0x177F & cc_data);
    } else {
        (*cc) = (cc_data & 0x0800 ? 0x01 : 0x00) | (cc_data & 0x0100 ? 0x02 : 0x00);
        return (eia608_control_t)(0x167F & cc_data);
    }
}